

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::PolymorphicCacheUtilizationArray::SetUtil
          (PolymorphicCacheUtilizationArray *this,FunctionBody *functionBody,uint index,byte util)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  Recycler *recycler;
  uchar **ppuVar5;
  byte util_local;
  uint index_local;
  FunctionBody *functionBody_local;
  PolymorphicCacheUtilizationArray *this_local;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1fe0,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = FunctionBody::GetInlineCacheCount(functionBody);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1fe1,"(index < functionBody->GetInlineCacheCount())",
                                "index < functionBody->GetInlineCacheCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  recycler = ScriptContext::GetRecycler(this_00);
  EnsureUtilArray(this,recycler,functionBody);
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__((WriteBarrierPtr *)this);
  (*ppuVar5)[index] = util;
  return;
}

Assistant:

void PolymorphicCacheUtilizationArray::SetUtil(Js::FunctionBody* functionBody, uint index, byte util)
    {
        Assert(functionBody);
        Assert(index < functionBody->GetInlineCacheCount());

        EnsureUtilArray(functionBody->GetScriptContext()->GetRecycler(), functionBody);
        this->utilArray[index] = util;
    }